

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

void CompressBinaryDump(char *file,uint head_size)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  int res;
  uint8_t *out;
  uLongf out_size;
  void *pvStack_30;
  uint32_t uncompressed_size;
  uint8_t *data;
  FILE *pFStack_20;
  uint32_t size;
  FILE *p;
  char *pcStack_10;
  uint head_size_local;
  char *file_local;
  
  p._4_4_ = head_size;
  pcStack_10 = file;
  pFStack_20 = fopen(file,"r");
  fseek(pFStack_20,0,2);
  lVar2 = ftell(pFStack_20);
  data._4_4_ = (uint)lVar2;
  fseek(pFStack_20,0,0);
  if (data._4_4_ < p._4_4_) {
    fclose(pFStack_20);
  }
  else {
    pvStack_30 = operator_new__((ulong)data._4_4_);
    fread(pvStack_30,1,(ulong)data._4_4_,pFStack_20);
    out_size._4_4_ = data._4_4_ - p._4_4_;
    out = (uint8_t *)compressBound(out_size._4_4_);
    __ptr = operator_new__((ulong)out);
    iVar1 = compress2(__ptr,&out,(long)pvStack_30 + (ulong)p._4_4_,out_size._4_4_,9);
    if (iVar1 != 0) {
      fprintf(_stderr,"compress2: error\n");
    }
    fclose(pFStack_20);
    pFStack_20 = fopen(pcStack_10,"w");
    fwrite(pvStack_30,(ulong)p._4_4_,1,pFStack_20);
    fwrite((void *)((long)&out_size + 4),4,1,pFStack_20);
    fwrite(__ptr,(size_t)out,1,pFStack_20);
    fclose(pFStack_20);
    if (pvStack_30 != (void *)0x0) {
      operator_delete__(pvStack_30);
    }
    if (__ptr != (void *)0x0) {
      operator_delete__(__ptr);
    }
  }
  return;
}

Assistant:

void CompressBinaryDump(const char* file, unsigned int head_size)
{
	// for simplicity ... copy the file into memory again and compress it there
	FILE* p = fopen(file,"r");
	fseek(p,0,SEEK_END);
	const uint32_t size = ftell(p);
	fseek(p,0,SEEK_SET);

	if (size<head_size) {
		fclose(p);
		return;
	}

	uint8_t* data = new uint8_t[size];
	fread(data,1,size,p);

	uint32_t uncompressed_size = size-head_size;
	uLongf out_size = (uLongf)compressBound(uncompressed_size);
	uint8_t* out = new uint8_t[out_size];

	int res = compress2(out,&out_size,data+head_size,uncompressed_size,9);
	if(res != Z_OK)
		fprintf(stderr, "compress2: error\n");
	fclose(p);
	p = fopen(file,"w");

	fwrite(data,head_size,1,p);
	fwrite(&uncompressed_size,4,1,p); // write size of uncompressed data
	fwrite(out,out_size,1,p);

	fclose(p);
	delete[] data;
	delete[] out;
}